

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

int32_t __thiscall
icu_63::RuleBasedCollator::internalNextSortKeyPart
          (RuleBasedCollator *this,UCharIterator *iter,uint32_t *state,uint8_t *dest,int32_t count,
          UErrorCode *errorCode)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  long lVar5;
  byte numeric;
  int32_t iVar6;
  RuleBasedCollator *pRVar7;
  int32_t iVar8;
  Level local_264;
  SortKeyByteSink local_260;
  uint32_t *local_240;
  RuleBasedCollator *local_238;
  PartLevelCallback callback;
  UIterCollationIterator ci;
  
  iVar6 = 0;
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if ((count < 0 || (state == (uint32_t *)0x0 || iter == (UCharIterator *)0x0)) ||
     (dest == (uint8_t *)0x0 && count != 0)) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  if (count == 0) {
    return 0;
  }
  local_260.appended_ = 0;
  local_260.super_ByteSink._vptr_ByteSink = (_func_int **)&PTR__SortKeyByteSink_003ca738;
  local_260.ignore_ = state[1];
  local_260.buffer_ = (char *)dest;
  local_260.capacity_ = count;
  local_238 = this;
  (*iter->move)(iter,0,UITER_START);
  pRVar7 = local_238;
  local_264 = *state;
  local_240 = state;
  if ((int)local_264 < 6) {
    bVar1 = (byte)local_238->settings->options;
    numeric = bVar1 >> 1 & 1;
    callback.super_LevelCallback._vptr_LevelCallback = (_func_int **)&PTR__LevelCallback_003ca798;
    callback.sink = &local_260;
    callback.levelCapacity = (local_260.capacity_ + local_260.ignore_) - local_260.appended_;
    callback.level = PRIMARY_LEVEL;
    if ((bVar1 & 1) == 0) {
      UIterCollationIterator::UIterCollationIterator(&ci,local_238->data,numeric,iter);
      CollationKeys::writeSortKeyUpToQuaternary
                (&ci.super_CollationIterator,pRVar7->data->compressibleBytes,pRVar7->settings,
                 &local_260,local_264,&callback.super_LevelCallback,'\0',errorCode);
      UIterCollationIterator::~UIterCollationIterator(&ci);
    }
    else {
      FCDUIterCollationIterator::FCDUIterCollationIterator
                ((FCDUIterCollationIterator *)&ci,local_238->data,numeric,iter,0);
      CollationKeys::writeSortKeyUpToQuaternary
                (&ci.super_CollationIterator,pRVar7->data->compressibleBytes,pRVar7->settings,
                 &local_260,local_264,&callback.super_LevelCallback,'\0',errorCode);
      FCDUIterCollationIterator::~FCDUIterCollationIterator((FCDUIterCollationIterator *)&ci);
    }
    bVar2 = false;
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if (count < local_260.appended_) {
        *(ulong *)local_240 = CONCAT44(callback.levelCapacity,callback.level);
        bVar2 = false;
        pRVar7 = (RuleBasedCollator *)(ulong)(uint)count;
      }
      else {
        bVar2 = true;
        if ((local_238->settings->options & 0xfffff000U) == 0xf000) {
          (*iter->move)(iter,0,UITER_START);
          local_264 = IDENTICAL_LEVEL;
        }
      }
    }
    else {
      pRVar7 = (RuleBasedCollator *)0x0;
    }
    iVar6 = (int32_t)pRVar7;
    CollationKeys::LevelCallback::~LevelCallback(&callback.super_LevelCallback);
    if (!bVar2) goto LAB_0022729e;
  }
  if (local_264 == IDENTICAL_LEVEL) {
    uVar3 = (local_260.capacity_ + local_260.ignore_) - local_260.appended_;
    ci.super_CollationIterator.super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003daac8;
    ci.super_CollationIterator.trie._0_2_ = 2;
    while (iVar4 = (*(code *)iter->next)(iter), -1 < iVar4) {
      UnicodeString::append((UnicodeString *)&ci,(char16_t)iVar4);
    }
    if (((ushort)ci.super_CollationIterator.trie & 0x11) == 0) {
      if (((ushort)ci.super_CollationIterator.trie & 2) != 0) {
        ci.super_CollationIterator.ceBuffer._0_8_ = (long)&ci.super_CollationIterator.trie + 2;
      }
    }
    else {
      ci.super_CollationIterator.ceBuffer._0_8_ = (UChar *)0x0;
    }
    if (-1 < (short)(ushort)ci.super_CollationIterator.trie) {
      ci.super_CollationIterator.trie._4_4_ =
           (int)(short)(ushort)ci.super_CollationIterator.trie >> 5;
    }
    writeIdenticalLevel(local_238,(UChar *)ci.super_CollationIterator.ceBuffer._0_8_,
                        (UChar *)(ci.super_CollationIterator.ceBuffer._0_8_ +
                                 (long)ci.super_CollationIterator.trie._4_4_ * 2),&local_260,
                        errorCode);
    bVar2 = false;
    iVar8 = 0;
    if ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
       (bVar2 = true, iVar8 = iVar6, count < local_260.appended_)) {
      *local_240 = 6;
      local_240[1] = uVar3;
      bVar2 = false;
      iVar8 = count;
    }
    UnicodeString::~UnicodeString((UnicodeString *)&ci);
    iVar6 = iVar8;
    if (!bVar2) goto LAB_0022729e;
  }
  local_240[0] = 7;
  local_240[1] = 0;
  for (lVar5 = (long)local_260.appended_; iVar6 = local_260.appended_,
      lVar5 < (long)(ulong)(uint)count; lVar5 = lVar5 + 1) {
    dest[lVar5] = '\0';
  }
LAB_0022729e:
  SortKeyByteSink::~SortKeyByteSink(&local_260);
  return iVar6;
}

Assistant:

int32_t
RuleBasedCollator::internalNextSortKeyPart(UCharIterator *iter, uint32_t state[2],
                                           uint8_t *dest, int32_t count, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    if(iter == NULL || state == NULL || count < 0 || (count > 0 && dest == NULL)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(count == 0) { return 0; }

    FixedSortKeyByteSink sink(reinterpret_cast<char *>(dest), count);
    sink.IgnoreBytes((int32_t)state[1]);
    iter->move(iter, 0, UITER_START);

    Collation::Level level = (Collation::Level)state[0];
    if(level <= Collation::QUATERNARY_LEVEL) {
        UBool numeric = settings->isNumeric();
        PartLevelCallback callback(sink);
        if(settings->dontCheckFCD()) {
            UIterCollationIterator ci(data, numeric, *iter);
            CollationKeys::writeSortKeyUpToQuaternary(ci, data->compressibleBytes, *settings,
                                                      sink, level, callback, FALSE, errorCode);
        } else {
            FCDUIterCollationIterator ci(data, numeric, *iter, 0);
            CollationKeys::writeSortKeyUpToQuaternary(ci, data->compressibleBytes, *settings,
                                                      sink, level, callback, FALSE, errorCode);
        }
        if(U_FAILURE(errorCode)) { return 0; }
        if(sink.NumberOfBytesAppended() > count) {
            state[0] = (uint32_t)callback.getLevel();
            state[1] = (uint32_t)callback.getLevelCapacity();
            return count;
        }
        // All of the normal levels are done.
        if(settings->getStrength() == UCOL_IDENTICAL) {
            level = Collation::IDENTICAL_LEVEL;
            iter->move(iter, 0, UITER_START);
        }
        // else fall through to setting ZERO_LEVEL
    }

    if(level == Collation::IDENTICAL_LEVEL) {
        int32_t levelCapacity = sink.GetRemainingCapacity();
        UnicodeString s;
        for(;;) {
            UChar32 c = iter->next(iter);
            if(c < 0) { break; }
            s.append((UChar)c);
        }
        const UChar *sArray = s.getBuffer();
        writeIdenticalLevel(sArray, sArray + s.length(), sink, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        if(sink.NumberOfBytesAppended() > count) {
            state[0] = (uint32_t)level;
            state[1] = (uint32_t)levelCapacity;
            return count;
        }
    }

    // ZERO_LEVEL: Fill the remainder of dest with 00 bytes.
    state[0] = (uint32_t)Collation::ZERO_LEVEL;
    state[1] = 0;
    int32_t length = sink.NumberOfBytesAppended();
    int32_t i = length;
    while(i < count) { dest[i++] = 0; }
    return length;
}